

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelside.cpp
# Opt level: O0

void __thiscall TPZGeoElSide::RemoveConnectivity(TPZGeoElSide *this)

{
  int iVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  TPZGeoElSide *in_RDI;
  TPZGeoElSide neighpos;
  TPZGeoElSide neigh;
  TPZGeoElSide neighpre;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  TPZGeoElSide *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  TPZGeoElSide local_38;
  TPZGeoElSide local_20;
  
  iVar1 = Exists(in_RDI);
  if (iVar1 != 0) {
    if ((in_RDI->fSide < 0) ||
       (iVar1 = in_RDI->fSide, iVar2 = (**(code **)(*(long *)in_RDI->fGeoEl + 0xf0))(),
       iVar2 <= iVar1)) {
      std::operator<<((ostream *)&std::cerr,"TPZGeoElSide::RemoveConnectivity Index out of bound\n")
      ;
    }
    TPZGeoElSide(in_stack_ffffffffffffff40);
    Neighbour((TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    pTVar3 = Element(&local_38);
    if ((pTVar3 == (TPZGeoEl *)0x0) || (iVar1 = Side(&local_38), iVar1 == -1)) {
      std::operator<<((ostream *)&std::cerr,
                      "TPZGeoElSide::RemoveConnectivity trying to remove null or inexistent connection"
                     );
    }
    TPZGeoElSide(in_stack_ffffffffffffff40,
                 (TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while( true ) {
      iVar1 = Exists(&local_38);
      in_stack_ffffffffffffff4c = in_stack_ffffffffffffff4c & 0xffffff;
      if (iVar1 != 0) {
        in_stack_ffffffffffffff48 = operator!=(&local_38,in_RDI);
        in_stack_ffffffffffffff4c =
             CONCAT13(in_stack_ffffffffffffff48 != 0,(int3)in_stack_ffffffffffffff4c);
      }
      if ((char)(in_stack_ffffffffffffff4c >> 0x18) == '\0') break;
      in_stack_ffffffffffffff40 = &local_38;
      operator=(in_stack_ffffffffffffff40,
                (TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      Neighbour((TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      operator=(in_stack_ffffffffffffff40,
                (TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      ~TPZGeoElSide((TPZGeoElSide *)0x19e055c);
    }
    iVar1 = operator==(&local_38,in_RDI);
    if (iVar1 == 0) {
      std::operator<<((ostream *)&std::cerr,
                      "TPZGeoElSide::RemoveConnectivity neighbourhood cycle error");
    }
    else {
      TPZGeoElSide(in_stack_ffffffffffffff40);
      SetNeighbour(in_stack_ffffffffffffff40,
                   (TPZGeoElSide *)CONCAT44(iVar1,in_stack_ffffffffffffff38));
      ~TPZGeoElSide((TPZGeoElSide *)0x19e05c2);
      iVar2 = Exists(&local_20);
      if (iVar2 != 0) {
        SetNeighbour(in_stack_ffffffffffffff40,(TPZGeoElSide *)CONCAT44(iVar1,iVar2));
      }
    }
    ~TPZGeoElSide((TPZGeoElSide *)0x19e0635);
    ~TPZGeoElSide((TPZGeoElSide *)0x19e0642);
    ~TPZGeoElSide((TPZGeoElSide *)0x19e064f);
  }
  return;
}

Assistant:

void TPZGeoElSide::RemoveConnectivity(){
	
	if(!Exists()) return;
	if(fSide < 0 || fSide >= fGeoEl->NSides()) {
		PZError << "TPZGeoElSide::RemoveConnectivity Index out of bound\n";
	}
	//it removes the connectivity of the cycle where this inserted one: 
	//neighpre->this->neighpos => neighpre->neighpos
	TPZGeoElSide neighpre,neigh = Neighbour();
	if(neigh.Element() == NULL || neigh.Side() == -1){
		PZError << "TPZGeoElSide::RemoveConnectivity trying to remove null or inexistent connection";
	}
	TPZGeoElSide neighpos = neigh;
	while(neigh.Exists() && neigh != *this){
		neighpre = neigh;
		neigh = neigh.Neighbour();
	}
	if(neigh == *this){
		this->SetNeighbour(TPZGeoElSide());
		if (neighpre.Exists()) neighpre.SetNeighbour(neighpos);
	} else {
		PZError << "TPZGeoElSide::RemoveConnectivity neighbourhood cycle error";
	}
}